

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  Type in0;
  Vec4 *local_b0;
  ulong local_a8;
  float local_a0 [10];
  Vector<float,_3> res;
  float afStack_68 [2];
  Vector<float,_3> res_1;
  undefined8 uStack_38;
  Matrix<float,_4,_3> retVal;
  
  puVar1 = &uStack_38;
  puVar2 = &uStack_38;
  puVar6 = &uStack_38;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar8) = uVar9;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar4 = lVar4 + 0x10;
    } while (lVar7 != 4);
    uStack_38 = *(undefined8 *)evalCtx->in[0].m_data;
    retVal.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    retVal.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    retVal.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    retVal.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    retVal.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    retVal.m_data.m_data[1].m_data[2] = 0.0;
    retVal.m_data.m_data[1].m_data[3] = 0.0;
    retVal.m_data.m_data[2].m_data[0] = 0.0;
    retVal.m_data.m_data[2].m_data[1] = 0.0;
    retVal.m_data.m_data[0].m_data[2] = 0.0;
    retVal.m_data.m_data[0].m_data[3] = 0.0;
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    uStack_38 = 0;
    retVal.m_data.m_data[0].m_data[0] = 0.0;
    retVal.m_data.m_data[0].m_data[1] = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar2 + lVar7 * 4) = *(undefined4 *)((long)puVar5 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  pfVar3 = afStack_68;
  afStack_68[0] = 0.0;
  afStack_68[1] = 0.0;
  lVar4 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar9;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar4 = lVar4 + 0x10;
  } while (lVar7 != 4);
  pfVar3 = afStack_68;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(uint *)((long)pfVar3 + lVar7) = *(uint *)((long)puVar6 + lVar7) ^ 0x80000000;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x30);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 4);
  } while (lVar4 != 4);
  res.m_data[1] = afStack_68[0];
  res.m_data[2] = afStack_68[1];
  local_a0[8] = 0.0;
  local_a0[9] = 0.0;
  res.m_data[0] = 0.0;
  local_b0 = (Vec4 *)0x0;
  local_a8 = local_a8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_b0 + lVar4 * 4) = res.m_data[lVar4 + 1] + res.m_data[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a0[5] = 0.0;
  local_a0[6] = 0.0;
  local_a0[7] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  local_a0[4] = 0.0;
  lVar4 = 0;
  do {
    local_a0[lVar4 + 2] = *(float *)((long)&local_b0 + lVar4 * 4) + local_a0[lVar4 + 5];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar4 * 4)] = local_a0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}